

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void SHA1Final(uchar *digest,SHA1_CTX *context)

{
  SHA1_CTX *in_RSI;
  long in_RDI;
  uchar c;
  uchar finalcount [8];
  uint i;
  uint32_t in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar1;
  
  for (uVar1 = 0; uVar1 < 8; uVar1 = uVar1 + 1) {
    (&stack0xffffffffffffffe4)[uVar1] =
         (char)(in_RSI->count[(int)(uint)(uVar1 < 4)] >>
               (('\x03' - ((byte)uVar1 & 3)) * '\b' & 0x1f));
  }
  SHA1Update(in_RSI,(uchar *)CONCAT44(uVar1,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4);
  while ((in_RSI->count[0] & 0x1f8) != 0x1c0) {
    SHA1Update(in_RSI,(uchar *)CONCAT44(uVar1,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4);
  }
  SHA1Update(in_RSI,(uchar *)CONCAT44(uVar1,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4);
  for (uVar1 = 0; uVar1 < 0x14; uVar1 = uVar1 + 1) {
    *(char *)(in_RDI + (ulong)uVar1) =
         (char)(in_RSI->state[uVar1 >> 2] >> (('\x03' - ((byte)uVar1 & 3)) * '\b' & 0x1f));
  }
  memset(in_RSI,0,0x5c);
  memset(&stack0xffffffffffffffe4,0,8);
  return;
}

Assistant:

void SHA1Final(
    unsigned char digest[20],
    SHA1_CTX * context
)
{
    unsigned i;

    unsigned char finalcount[8];

    unsigned char c;

#if 0    /* untested "improvement" by DHR */
    /* Convert context->count to a sequence of bytes
     * in finalcount.  Second element first, but
     * big-endian order within element.
     * But we do it all backwards.
     */
    unsigned char *fcp = &finalcount[8];

    for (i = 0; i < 2; i++)
    {
        uint32_t t = context->count[i];

        int j;

        for (j = 0; j < 4; t >>= 8, j++)
            *--fcp = (unsigned char) t}
#else
    for (i = 0; i < 8; i++)
    {
        finalcount[i] = (unsigned char) ((context->count[(i >= 4 ? 0 : 1)] >> ((3 - (i & 3)) * 8)) & 255);      /* Endian independent */
    }
#endif
    c = 0200;
    SHA1Update(context, &c, 1);
    while ((context->count[0] & 504) != 448)
    {
        c = 0000;
        SHA1Update(context, &c, 1);
    }
    SHA1Update(context, finalcount, 8); /* Should cause a SHA1Transform() */
    for (i = 0; i < 20; i++)
    {
        digest[i] = (unsigned char)
            ((context->state[i >> 2] >> ((3 - (i & 3)) * 8)) & 255);
    }
    /* Wipe variables */
    memset(context, '\0', sizeof(*context));
    memset(&finalcount, '\0', sizeof(finalcount));
}